

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O2

void ParseOptionMenuBody(FScanner *sc,FOptionMenuDescriptor *desc)

{
  TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this;
  bool bVar1;
  EColorRange EVar2;
  PClass *ti;
  FOptionMenuItem *pFVar3;
  FOptionMenuItemOption *this_00;
  FOptionMenuItemSafeCommand *this_01;
  FOptionMenuItemControl *this_02;
  FOptionMenuItemColorPicker *this_03;
  FOptionMenuItemStaticTextSwitchable *this_04;
  FOptionMenuSliderCVar *this_05;
  FOptionMenuScreenResolutionLine *this_06;
  FOptionMenuTextField *this_07;
  FOptionMenuNumberField *this_08;
  FKeyBindings *bindings;
  FOptionMenuDescriptor *pFVar4;
  int iVar5;
  float minimum;
  FString label;
  FOptionMenuItem *it;
  FString check;
  FOptionMenuItem *it_2;
  double local_68;
  double local_60;
  FOptionMenuItem *local_58;
  FName local_4c;
  double local_48;
  FString *local_40;
  FOptionMenuItem *it_11;
  
  FScanner::MustGetStringName(sc,"{");
  this = &desc->mItems;
  local_40 = &desc->mTitle;
  local_58 = (FOptionMenuItem *)FString::NullString.Nothing;
  do {
    while( true ) {
      while( true ) {
        bVar1 = FScanner::CheckString(sc,"}");
        if (bVar1) {
          return;
        }
        FScanner::MustGetString(sc);
        bVar1 = FScanner::Compare(sc,"else");
        if (!bVar1) break;
        SkipSubBlock(sc);
      }
      bVar1 = FScanner::Compare(sc,"ifgame");
      if (!bVar1) break;
      bVar1 = CheckSkipGameBlock(sc);
LAB_003578a3:
      if (bVar1 == false) {
        ParseOptionMenuBody(sc,desc);
      }
    }
    bVar1 = FScanner::Compare(sc,"ifoption");
    if (bVar1) {
      bVar1 = CheckSkipOptionBlock(sc);
      goto LAB_003578a3;
    }
    bVar1 = FScanner::Compare(sc,"Class");
    if (bVar1) {
      FScanner::MustGetString(sc);
      ti = PClass::FindClass(sc->String);
      if (ti == (PClass *)0x0) {
LAB_003578f2:
        FScanner::ScriptError(sc,"Unknown menu class \'%s\'",sc->String);
      }
      else {
        bVar1 = PClass::IsAncestorOf(DOptionMenu::RegistrationInfo.MyClass,ti);
        if (!bVar1) goto LAB_003578f2;
      }
      (desc->super_FMenuDescriptor).mClass = ti;
    }
    else {
      bVar1 = FScanner::Compare(sc,"Title");
      if (bVar1) {
        FScanner::MustGetString(sc);
        FString::operator=(local_40,sc->String);
      }
      else {
        bVar1 = FScanner::Compare(sc,"Position");
        if (bVar1) {
          FScanner::MustGetNumber(sc);
          desc->mPosition = sc->Number;
        }
        else {
          bVar1 = FScanner::Compare(sc,"DefaultSelection");
          if (bVar1) {
            FScanner::MustGetNumber(sc);
            desc->mSelectedItem = sc->Number;
          }
          else {
            bVar1 = FScanner::Compare(sc,"ScrollTop");
            if (bVar1) {
              FScanner::MustGetNumber(sc);
              desc->mScrollTop = sc->Number;
            }
            else {
              bVar1 = FScanner::Compare(sc,"Indent");
              if (bVar1) {
                FScanner::MustGetNumber(sc);
                desc->mIndent = sc->Number;
              }
              else {
                bVar1 = FScanner::Compare(sc,"Submenu");
                if (bVar1) {
                  FScanner::MustGetString(sc);
                  FString::FString(&label,sc->String);
                  FScanner::MustGetStringName(sc,",");
                  FScanner::MustGetString(sc);
                  pFVar3 = (FOptionMenuItem *)operator_new(0x28);
                  FOptionMenuItemSubmenu::FOptionMenuItemSubmenu
                            ((FOptionMenuItemSubmenu *)pFVar3,label.Chars,sc->String,0);
                  it = pFVar3;
                  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
                  goto LAB_00357c9a;
                }
                bVar1 = FScanner::Compare(sc,"Option");
                if (bVar1) {
                  FScanner::MustGetString(sc);
                  FString::FString(&label,sc->String);
                  FScanner::MustGetStringName(sc,",");
                  FScanner::MustGetString(sc);
                  FString::FString((FString *)&it,sc->String);
                  FScanner::MustGetStringName(sc,",");
                  FScanner::MustGetString(sc);
                  FString::FString(&check,sc->String);
                  it_2 = local_58;
                  FString::NullString.RefCount = FString::NullString.RefCount + 1;
                  bVar1 = FScanner::CheckString(sc,",");
                  iVar5 = 0;
                  if (bVar1) {
                    FScanner::MustGetString(sc);
                    if (*sc->String != '\0') {
                      FString::operator=((FString *)&it_2,sc->String);
                    }
                    bVar1 = FScanner::CheckString(sc,",");
                    iVar5 = 0;
                    if (bVar1) {
                      FScanner::MustGetNumber(sc);
                      iVar5 = sc->Number;
                    }
                  }
                  this_00 = (FOptionMenuItemOption *)operator_new(0x40);
                  FOptionMenuItemOption::FOptionMenuItemOption
                            (this_00,label.Chars,(char *)it,check.Chars,(char *)it_2,iVar5);
                  it_11 = (FOptionMenuItem *)this_00;
                  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it_11);
                  FString::~FString((FString *)&it_2);
                  goto LAB_00357c86;
                }
                bVar1 = FScanner::Compare(sc,"Command");
                if (bVar1) {
                  FScanner::MustGetString(sc);
                  FString::FString(&label,sc->String);
                  FScanner::MustGetStringName(sc,",");
                  FScanner::MustGetString(sc);
                  pFVar3 = (FOptionMenuItem *)operator_new(0x28);
                  FOptionMenuItemCommand::FOptionMenuItemCommand
                            ((FOptionMenuItemCommand *)pFVar3,label.Chars,sc->String);
                  it = pFVar3;
                  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
                  goto LAB_00357c9a;
                }
                bVar1 = FScanner::Compare(sc,"SafeCommand");
                if (bVar1) {
                  FScanner::MustGetString(sc);
                  FString::FString(&label,sc->String);
                  FScanner::MustGetStringName(sc,",");
                  FScanner::MustGetString(sc);
                  FString::FString((FString *)&it,sc->String);
                  check.Chars = (char *)local_58;
                  FString::NullString.RefCount = FString::NullString.RefCount + 1;
                  bVar1 = FScanner::CheckString(sc,",");
                  if (bVar1) {
                    FScanner::MustGetString(sc);
                    FString::operator=(&check,sc->String);
                  }
                  this_01 = (FOptionMenuItemSafeCommand *)operator_new(0x30);
                  FOptionMenuItemSafeCommand::FOptionMenuItemSafeCommand
                            (this_01,label.Chars,(char *)it,check.Chars);
                  it_2 = (FOptionMenuItem *)this_01;
                  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it_2);
                  goto LAB_00357c86;
                }
                bVar1 = FScanner::Compare(sc,"Control");
                if (bVar1) {
LAB_00357cce:
                  bVar1 = FScanner::Compare(sc,"MapControl");
                  FScanner::MustGetString(sc);
                  FString::FString(&label,sc->String);
                  FScanner::MustGetStringName(sc,",");
                  FScanner::MustGetString(sc);
                  this_02 = (FOptionMenuItemControl *)operator_new(0x38);
                  bindings = &Bindings;
                  if (bVar1) {
                    bindings = &AutomapBindings;
                  }
                  FOptionMenuItemControl::FOptionMenuItemControl
                            (this_02,label.Chars,sc->String,bindings);
                  it = (FOptionMenuItem *)this_02;
                  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
LAB_00357c9a:
                  FString::~FString(&label);
                }
                else {
                  bVar1 = FScanner::Compare(sc,"MapControl");
                  if (bVar1) goto LAB_00357cce;
                  bVar1 = FScanner::Compare(sc,"ColorPicker");
                  if (bVar1) {
                    FScanner::MustGetString(sc);
                    FString::FString(&label,sc->String);
                    FScanner::MustGetStringName(sc,",");
                    FScanner::MustGetString(sc);
                    this_03 = (FOptionMenuItemColorPicker *)operator_new(0x30);
                    FOptionMenuItemColorPicker::FOptionMenuItemColorPicker
                              (this_03,label.Chars,sc->String);
                    it = (FOptionMenuItem *)this_03;
                    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
                    goto LAB_00357c9a;
                  }
                  bVar1 = FScanner::Compare(sc,"StaticText");
                  if (bVar1) {
                    FScanner::MustGetString(sc);
                    pFVar4 = (FOptionMenuDescriptor *)sc->String;
                    FString::FString(&label,(char *)pFVar4);
                    EVar2 = ParseOptionColor(sc,pFVar4);
                    pFVar3 = (FOptionMenuItem *)operator_new(0x28);
                    FOptionMenuItemStaticText::FOptionMenuItemStaticText
                              ((FOptionMenuItemStaticText *)pFVar3,label.Chars,EVar2);
                    it = pFVar3;
                    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
                    goto LAB_00357c9a;
                  }
                  bVar1 = FScanner::Compare(sc,"StaticTextSwitchable");
                  if (bVar1) {
                    FScanner::MustGetString(sc);
                    FString::FString(&label,sc->String);
                    FScanner::MustGetStringName(sc,",");
                    FScanner::MustGetString(sc);
                    FString::FString((FString *)&it,sc->String);
                    FScanner::MustGetStringName(sc,",");
                    FScanner::MustGetString(sc);
                    pFVar4 = (FOptionMenuDescriptor *)sc->String;
                    FName::FName((FName *)&it_2,(char *)pFVar4);
                    EVar2 = ParseOptionColor(sc,pFVar4);
                    this_04 = (FOptionMenuItemStaticTextSwitchable *)operator_new(0x38);
                    local_4c.Index = (int)it_2;
                    FOptionMenuItemStaticTextSwitchable::FOptionMenuItemStaticTextSwitchable
                              (this_04,label.Chars,(char *)it,&local_4c,EVar2);
                    check.Chars = (char *)this_04;
                    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                               (FOptionMenuItem **)&check);
LAB_00357c90:
                    FString::~FString((FString *)&it);
                    goto LAB_00357c9a;
                  }
                  bVar1 = FScanner::Compare(sc,"Slider");
                  if (bVar1) {
                    FScanner::MustGetString(sc);
                    FString::FString(&label,sc->String);
                    FScanner::MustGetStringName(sc,",");
                    FScanner::MustGetString(sc);
                    FString::FString((FString *)&it,sc->String);
                    FScanner::MustGetStringName(sc,",");
                    FScanner::MustGetFloat(sc);
                    local_60 = sc->Float;
                    FScanner::MustGetStringName(sc,",");
                    FScanner::MustGetFloat(sc);
                    local_68 = sc->Float;
                    FScanner::MustGetStringName(sc,",");
                    FScanner::MustGetFloat(sc);
                    local_48 = sc->Float;
                    bVar1 = FScanner::CheckString(sc,",");
                    iVar5 = 1;
                    if (bVar1) {
                      FScanner::MustGetNumber(sc);
                      iVar5 = sc->Number;
                    }
                    this_05 = (FOptionMenuSliderCVar *)operator_new(0x58);
                    FOptionMenuSliderCVar::FOptionMenuSliderCVar
                              (this_05,label.Chars,(char *)it,local_60,local_68,local_48,iVar5);
                    check.Chars = (char *)this_05;
                    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                               (FOptionMenuItem **)&check);
                    goto LAB_00357c90;
                  }
                  bVar1 = FScanner::Compare(sc,"screenresolution");
                  if (bVar1) {
                    FScanner::MustGetString(sc);
                    this_06 = (FOptionMenuScreenResolutionLine *)operator_new(0x50);
                    FOptionMenuScreenResolutionLine::FOptionMenuScreenResolutionLine
                              (this_06,sc->String);
                    label.Chars = (char *)this_06;
                    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                               (FOptionMenuItem **)&label);
                  }
                  else {
                    bVar1 = FScanner::Compare(sc,"TextField");
                    if (bVar1) {
                      FScanner::MustGetString(sc);
                      FString::FString(&label,sc->String);
                      FScanner::MustGetStringName(sc,",");
                      FScanner::MustGetString(sc);
                      FString::FString((FString *)&it,sc->String);
                      check.Chars = (char *)local_58;
                      FString::NullString.RefCount = FString::NullString.RefCount + 1;
                      bVar1 = FScanner::CheckString(sc,",");
                      if (bVar1) {
                        FScanner::MustGetString(sc);
                        FString::operator=(&check,sc->String);
                      }
                      this_07 = (FOptionMenuTextField *)operator_new(0xc0);
                      FOptionMenuTextField::FOptionMenuTextField
                                (this_07,label.Chars,(char *)it,check.Chars);
                      it_2 = (FOptionMenuItem *)this_07;
                      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it_2);
LAB_00357c86:
                      FString::~FString(&check);
                      goto LAB_00357c90;
                    }
                    bVar1 = FScanner::Compare(sc,"NumberField");
                    if (bVar1) {
                      FScanner::MustGetString(sc);
                      FString::FString(&label,sc->String);
                      FScanner::MustGetStringName(sc,",");
                      FScanner::MustGetString(sc);
                      FString::FString((FString *)&it,sc->String);
                      check.Chars = (char *)local_58;
                      FString::NullString.RefCount = FString::NullString.RefCount + 1;
                      bVar1 = FScanner::CheckString(sc,",");
                      minimum = 0.0;
                      local_60 = (double)CONCAT44(local_60._4_4_,0x42c80000);
                      local_68 = (double)CONCAT44(local_68._4_4_,0x3f800000);
                      if (bVar1) {
                        FScanner::MustGetFloat(sc);
                        minimum = (float)sc->Float;
                        FScanner::MustGetStringName(sc,",");
                        FScanner::MustGetFloat(sc);
                        local_60 = (double)CONCAT44(local_60._4_4_,(float)sc->Float);
                        bVar1 = FScanner::CheckString(sc,",");
                        if (bVar1) {
                          FScanner::MustGetFloat(sc);
                          local_68 = (double)CONCAT44(local_68._4_4_,(float)sc->Float);
                          bVar1 = FScanner::CheckString(sc,",");
                          if (bVar1) {
                            FScanner::MustGetString(sc);
                            FString::operator=(&check,sc->String);
                          }
                        }
                        else {
                          local_68 = (double)CONCAT44(local_68._4_4_,0x3f800000);
                        }
                      }
                      this_08 = (FOptionMenuNumberField *)operator_new(0x48);
                      FOptionMenuNumberField::FOptionMenuNumberField
                                (this_08,label.Chars,(char *)it,minimum,local_60._0_4_,
                                 local_68._0_4_,check.Chars);
                      it_2 = (FOptionMenuItem *)this_08;
                      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                                (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it_2);
                      goto LAB_00357c86;
                    }
                    FScanner::ScriptError(sc,"Unknown keyword \'%s\'",sc->String);
                  }
                }
              }
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

static void ParseOptionMenuBody(FScanner &sc, FOptionMenuDescriptor *desc)
{
	sc.MustGetStringName("{");
	while (!sc.CheckString("}"))
	{
		sc.MustGetString();
		if (sc.Compare("else"))
		{
			SkipSubBlock(sc);
		}
		else if (sc.Compare("ifgame"))
		{
			if (!CheckSkipGameBlock(sc))
			{
				// recursively parse sub-block
				ParseOptionMenuBody(sc, desc);
			}
		}
		else if (sc.Compare("ifoption"))
		{
			if (!CheckSkipOptionBlock(sc))
			{
				// recursively parse sub-block
				ParseOptionMenuBody(sc, desc);
			}
		}
		else if (sc.Compare("Class"))
		{
			sc.MustGetString();
			const PClass *cls = PClass::FindClass(sc.String);
			if (cls == NULL || !cls->IsDescendantOf(RUNTIME_CLASS(DOptionMenu)))
			{
				sc.ScriptError("Unknown menu class '%s'", sc.String);
			}
			desc->mClass = cls;
		}
		else if (sc.Compare("Title"))
		{
			sc.MustGetString();
			desc->mTitle = sc.String;
		}
		else if (sc.Compare("Position"))
		{
			sc.MustGetNumber();
			desc->mPosition = sc.Number;
		}
		else if (sc.Compare("DefaultSelection"))
		{
			sc.MustGetNumber();
			desc->mSelectedItem = sc.Number;
		}
		else if (sc.Compare("ScrollTop"))
		{
			sc.MustGetNumber();
			desc->mScrollTop = sc.Number;
		}
		else if (sc.Compare("Indent"))
		{
			sc.MustGetNumber();
			desc->mIndent = sc.Number;
		}
		else if (sc.Compare("Submenu"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemSubmenu(label, sc.String);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Option"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString cvar = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString values = sc.String;
			FString check;
			int center = 0;
			if (sc.CheckString(","))
			{
				sc.MustGetString();
				if (*sc.String != 0) check = sc.String;
				if (sc.CheckString(","))
				{
					sc.MustGetNumber();
					center = sc.Number;
				}
			}
			FOptionMenuItem *it = new FOptionMenuItemOption(label, cvar, values, check, center);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Command"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemCommand(label, sc.String);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("SafeCommand"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString command = sc.String;
			FString prompt;
			// Check for optional custom prompt
			if (sc.CheckString(","))
			{
				sc.MustGetString();
				prompt = sc.String;
			}
			FOptionMenuItem *it = new FOptionMenuItemSafeCommand(label, command, prompt);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Control") || sc.Compare("MapControl"))
		{
			bool map = sc.Compare("MapControl");
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemControl(label, sc.String, map? &AutomapBindings : &Bindings);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("ColorPicker"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemColorPicker(label, sc.String);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("StaticText"))
		{
			sc.MustGetString();
			FString label = sc.String;
			EColorRange cr = ParseOptionColor(sc, desc);
			FOptionMenuItem *it = new FOptionMenuItemStaticText(label, cr);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("StaticTextSwitchable"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString label2 = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FName action = sc.String;
			EColorRange cr = ParseOptionColor(sc, desc);
			FOptionMenuItem *it = new FOptionMenuItemStaticTextSwitchable(label, label2, action, cr);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Slider"))
		{
			sc.MustGetString();
			FString text = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString action = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetFloat();
			double min = sc.Float;
			sc.MustGetStringName(",");
			sc.MustGetFloat();
			double max = sc.Float;
			sc.MustGetStringName(",");
			sc.MustGetFloat();
			double step = sc.Float;
			int showvalue = 1;
			if (sc.CheckString(","))
			{
				sc.MustGetNumber();
				showvalue = sc.Number;
			}
			FOptionMenuItem *it = new FOptionMenuSliderCVar(text, action, min, max, step, showvalue);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("screenresolution"))
		{
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuScreenResolutionLine(sc.String);
			desc->mItems.Push(it);
		}
		// [TP] -- Text input widget
		else if ( sc.Compare( "TextField" ))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName( "," );
			sc.MustGetString();
			FString cvar = sc.String;
			FString check;
			
			if ( sc.CheckString( "," ))
			{
				sc.MustGetString();
				check = sc.String;
			}

			FOptionMenuItem* it = new FOptionMenuTextField( label, cvar, check );
			desc->mItems.Push( it );
		}
		// [TP] -- Number input widget
		else if ( sc.Compare( "NumberField" ))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName( "," );
			sc.MustGetString();
			FString cvar = sc.String;
			float minimum = 0.0f;
			float maximum = 100.0f;
			float step = 1.0f;
			FString check;

			if ( sc.CheckString( "," ))
			{
				sc.MustGetFloat();
				minimum = (float) sc.Float;
				sc.MustGetStringName( "," );
				sc.MustGetFloat();
				maximum = (float) sc.Float;

				if ( sc.CheckString( "," ))
				{
					sc.MustGetFloat();
					step = (float) sc.Float;

					if ( sc.CheckString( "," ))
					{
						sc.MustGetString();
						check = sc.String;
					}
				}
			}

			FOptionMenuItem* it = new FOptionMenuNumberField( label, cvar,
				minimum, maximum, step, check );
			desc->mItems.Push( it );
		}
		else
		{
			sc.ScriptError("Unknown keyword '%s'", sc.String);
		}
	}
}